

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int dir_scan_callback(de *de,void *data)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  void *local_30;
  de *entries;
  dir_scan_data *dsd;
  void *data_local;
  de *de_local;
  
  local_30 = *data;
  if ((local_30 == (void *)0x0) || (*(ulong *)((long)data + 0x10) <= *(ulong *)((long)data + 8))) {
    local_30 = mg_realloc(local_30,*(long *)((long)data + 0x10) * 0x50);
    if (local_30 == (void *)0x0) {
      return 1;
    }
    *(void **)data = local_30;
    *(long *)((long)data + 0x10) = *(long *)((long)data + 0x10) << 1;
  }
  pcVar2 = mg_strdup(de->file_name);
  *(char **)((long)local_30 + *(long *)((long)data + 8) * 0x28) = pcVar2;
  bVar3 = *(long *)((long)local_30 + *(long *)((long)data + 8) * 0x28) != 0;
  if (bVar3) {
    lVar1 = *(long *)((long)data + 8);
    *(uint64_t *)((long)local_30 + lVar1 * 0x28 + 8) = (de->file).size;
    *(time_t *)((long)local_30 + lVar1 * 0x28 + 0x10) = (de->file).last_modified;
    *(undefined8 *)((long)local_30 + lVar1 * 0x28 + 0x18) = *(undefined8 *)&(de->file).is_directory;
    *(undefined8 *)((long)local_30 + lVar1 * 0x28 + 0x20) = *(undefined8 *)&(de->file).location;
    *(long *)((long)data + 8) = *(long *)((long)data + 8) + 1;
  }
  de_local._4_4_ = (uint)!bVar3;
  return de_local._4_4_;
}

Assistant:

static int
dir_scan_callback(struct de *de, void *data)
{
	struct dir_scan_data *dsd = (struct dir_scan_data *)data;
	struct de *entries = dsd->entries;

	if ((entries == NULL) || (dsd->num_entries >= dsd->arr_size)) {
		/* Here "entries" is a temporary pointer and can be replaced,
		 * "dsd->entries" is the original pointer */
		entries =
		    (struct de *)mg_realloc(entries,
		                            dsd->arr_size * 2 * sizeof(entries[0]));
		if (entries == NULL) {
			/* stop scan */
			return 1;
		}
		dsd->entries = entries;
		dsd->arr_size *= 2;
	}
	entries[dsd->num_entries].file_name = mg_strdup(de->file_name);
	if (entries[dsd->num_entries].file_name == NULL) {
		/* stop scan */
		return 1;
	}
	entries[dsd->num_entries].file = de->file;
	dsd->num_entries++;

	return 0;
}